

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O2

size_t __thiscall breakpoint_recorder::add_func(breakpoint_recorder *this,var *function)

{
  bool bVar1;
  type_info *ptVar2;
  object_method *poVar3;
  callable *this_00;
  function *pfVar4;
  runtime_error *prVar5;
  allocator local_39;
  string local_38;
  
  ptVar2 = cs_impl::any::type(function);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&cs::object_method::typeinfo);
  if (bVar1) {
    poVar3 = cs_impl::any::const_val<cs::object_method>(function);
    cs_impl::any::operator=(function,&poVar3->callable);
  }
  else {
    ptVar2 = cs_impl::any::type(function);
    bVar1 = std::type_info::operator!=(ptVar2,(type_info *)&cs::callable::typeinfo);
    if (bVar1) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_38,"Debugger just can break at specific line or function.",
                 &local_39);
      cs::runtime_error::runtime_error(prVar5,&local_38);
      __cxa_throw(prVar5,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
  }
  this_00 = cs_impl::any::const_val<cs::callable>(function);
  ptVar2 = std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
           ::target_type(&this_00->mFunc);
  bVar1 = std::type_info::operator!=(ptVar2,(type_info *)&cs::function::typeinfo);
  if (!bVar1) {
    pfVar4 = std::
             function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
             target<cs::function>(&this_00->mFunc);
    pfVar4->mMatch = true;
    m_id = m_id + 1;
    std::
    forward_list<breakpoint_recorder::breakpoint,std::allocator<breakpoint_recorder::breakpoint>>::
    emplace_front<unsigned_long&,cs_impl::any&>
              ((forward_list<breakpoint_recorder::breakpoint,std::allocator<breakpoint_recorder::breakpoint>>
                *)this,&m_id,function);
    return m_id;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"Debugger can not break at CNI function.",&local_39);
  cs::runtime_error::runtime_error(prVar5,&local_38);
  __cxa_throw(prVar5,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

std::size_t add_func(cs::var function)
	{
		if (function.type() == typeid(cs::object_method))
			function = function.const_val<cs::object_method>().callable;
		else if (function.type() != typeid(cs::callable))
			throw cs::runtime_error("Debugger just can break at specific line or function.");
		const cs::callable::function_type &target = function.const_val<cs::callable>().get_raw_data();
		if (target.target_type() != typeid(cs::function))
			throw cs::runtime_error("Debugger can not break at CNI function.");
		target.target<cs::function>()->set_debugger_state(true);
		m_breakpoints.emplace_front(++m_id, function);
		return m_id;
	}